

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O2

Bbr_ImageTree_t *
Bbr_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars,
                 int nBddMax,int fVerbose)

{
  size_t __size;
  DdHalfWord DVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  long lVar9;
  void *__ptr;
  undefined8 *puVar10;
  DdNode **F;
  DdNode *pDVar11;
  void *__ptr_00;
  DdHalfWord *pDVar12;
  DdNode *n;
  void *__ptr_01;
  long lVar13;
  Bbr_ImageNode_t *pBVar14;
  Bbr_ImageTree_t *pBVar15;
  Bbr_ImageNode_t *pBVar16;
  int iVar17;
  anon_union_16_2_50f58667_for_type *paVar18;
  ulong uVar19;
  Bbr_ImageNode_t *pNode2;
  int iVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  double dVar28;
  double dVar29;
  
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    pDVar7 = Cudd_Support(dd,bCare);
    Cudd_Ref(pDVar7);
    pDVar8 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
    Cudd_Ref(pDVar8);
    puts("The latch dependency matrix:");
    printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",(ulong)(uint)nParts,
           (ulong)(uint)dd->size,(ulong)(uint)nVars);
    printf("     : ");
    for (uVar23 = 0; (int)uVar23 < dd->size; uVar23 = uVar23 + 1) {
      printf("%d",(ulong)uVar23 % 10);
    }
    putchar(10);
    uVar19 = 0;
    uVar24 = 0;
    if (0 < nParts) {
      uVar24 = (ulong)(uint)nParts;
    }
    for (; uVar24 != uVar19; uVar19 = uVar19 + 1) {
      Bbr_bddImagePrintLatchDependencyOne(dd,pbParts[uVar19],pDVar7,pDVar8,(int)uVar19);
    }
    Bbr_bddImagePrintLatchDependencyOne(dd,bCare,pDVar7,pDVar8,nParts);
    Cudd_RecursiveDeref(dd,pDVar7);
    Cudd_RecursiveDeref(dd,pDVar8);
  }
  uVar23 = nParts + 1;
  lVar9 = (long)nParts;
  __size = lVar9 * 8 + 8;
  __ptr = malloc(__size);
  uVar24 = 0;
  uVar19 = 0;
  if (0 < nParts) {
    uVar19 = (ulong)(uint)nParts;
  }
  for (; puVar10 = (undefined8 *)malloc(0x18), uVar19 != uVar24; uVar24 = uVar24 + 1) {
    *(undefined8 **)((long)__ptr + uVar24 * 8) = puVar10;
    pDVar7 = pbParts[uVar24];
    *puVar10 = pDVar7;
    Cudd_Ref(pDVar7);
    pDVar7 = Cudd_Support(dd,(DdNode *)*puVar10);
    puVar10[1] = pDVar7;
    Cudd_Ref(pDVar7);
    iVar5 = Cudd_SupportSize(dd,(DdNode *)puVar10[1]);
    *(short *)((long)puVar10 + 0x14) = (short)iVar5;
    iVar5 = Cudd_DagSize((DdNode *)*puVar10);
    *(int *)(puVar10 + 2) = iVar5;
    *(short *)((long)puVar10 + 0x16) = (short)uVar24;
  }
  *(undefined8 **)((long)__ptr + lVar9 * 8) = puVar10;
  *puVar10 = bCare;
  Cudd_Ref(bCare);
  pDVar7 = Cudd_Support(dd,(DdNode *)*puVar10);
  puVar10[1] = pDVar7;
  Cudd_Ref(pDVar7);
  iVar5 = Cudd_SupportSize(dd,(DdNode *)puVar10[1]);
  *(short *)((long)puVar10 + 0x14) = (short)iVar5;
  iVar5 = Cudd_DagSize((DdNode *)*puVar10);
  *(int *)(puVar10 + 2) = iVar5;
  *(short *)((long)puVar10 + 0x16) = (short)nParts;
  F = (DdNode **)malloc(__size);
  uVar19 = 0;
  uVar24 = 0;
  if (0 < (int)uVar23) {
    uVar24 = (ulong)uVar23;
  }
  for (; uVar24 != uVar19; uVar19 = uVar19 + 1) {
    F[uVar19] = *(DdNode **)(*(long *)((long)__ptr + uVar19 * 8) + 8);
  }
  pDVar7 = Cudd_VectorSupport(dd,F,uVar23);
  Cudd_Ref(pDVar7);
  free(F);
  pDVar8 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(pDVar8);
  pDVar11 = Cudd_bddExistAbstract(dd,pDVar7,pDVar8);
  Cudd_Ref(pDVar11);
  Cudd_RecursiveDeref(dd,pDVar7);
  Cudd_RecursiveDeref(dd,pDVar8);
  Cudd_SupportSize(dd,pDVar11);
  __ptr_00 = calloc(1,(long)dd->size << 3);
  for (pDVar7 = pDVar11; pDVar8 = dd->one, pDVar7 != pDVar8; pDVar7 = (pDVar7->type).kids.T) {
    DVar1 = pDVar7->index;
    pDVar12 = (DdHalfWord *)malloc(0x18);
    *(DdHalfWord **)((long)__ptr_00 + (long)(int)DVar1 * 8) = pDVar12;
    *pDVar12 = DVar1;
    Cudd_Ref(pDVar8);
    iVar5 = 0;
    for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
      iVar6 = Cudd_bddLeq(dd,*(DdNode **)(*(long *)((long)__ptr + uVar19 * 8) + 8),
                          dd->vars[pDVar7->index]);
      n = pDVar8;
      if (iVar6 != 0) {
        n = Cudd_bddAnd(dd,pDVar8,dd->vars[uVar19]);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar8);
        iVar5 = iVar5 + 1;
      }
      pDVar8 = n;
    }
    lVar13 = *(long *)((long)__ptr_00 + (long)(int)DVar1 * 8);
    *(DdNode **)(lVar13 + 8) = pDVar8;
    *(int *)(lVar13 + 0x10) = iVar5;
  }
  Cudd_RecursiveDeref(dd,pDVar11);
  uVar23 = dd->size;
  __ptr_01 = malloc(__size);
  for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
    puVar10 = (undefined8 *)calloc(1,0x30);
    *(undefined8 **)((long)__ptr_01 + uVar19 * 8) = puVar10;
    *puVar10 = dd;
    puVar10[5] = *(undefined8 *)((long)__ptr + uVar19 * 8);
  }
  uVar21 = 0;
  uVar19 = (ulong)uVar23;
  if ((int)uVar23 < 1) {
    uVar19 = uVar21;
  }
  for (; uVar19 != uVar21; uVar21 = uVar21 + 1) {
    pvVar3 = *(void **)((long)__ptr_00 + uVar21 * 8);
    if (pvVar3 != (void *)0x0) {
      if (*(int *)((long)pvVar3 + 0x10) < 1) {
        __assert_fail("pVars[v]->nParts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x21a,
                      "Bbr_ImageNode_t **Bbr_CreateNodes(DdManager *, int, Bbr_ImagePart_t **, int, Bbr_ImageVar_t **)"
                     );
      }
      if (*(int *)((long)pvVar3 + 0x10) == 1) {
        lVar13 = *(long *)((long)__ptr_01 + (long)**(int **)((long)pvVar3 + 8) * 8);
        pDVar7 = *(DdNode **)(lVar13 + 8);
        pDVar8 = dd->vars[uVar21];
        if (pDVar7 == (DdNode *)0x0) {
          *(DdNode **)(lVar13 + 8) = pDVar8;
          Cudd_Ref(pDVar8);
        }
        else {
          pDVar8 = Cudd_bddAnd(dd,pDVar7,pDVar8);
          *(DdNode **)(lVar13 + 8) = pDVar8;
          Cudd_Ref(pDVar8);
          Cudd_RecursiveDeref(dd,pDVar7);
        }
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + 8));
        free(pvVar3);
        *(undefined8 *)((long)__ptr_00 + uVar21 * 8) = 0;
      }
    }
  }
  for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
    lVar13 = *(long *)((long)__ptr_01 + uVar19 * 8);
    puVar10 = *(undefined8 **)((long)__ptr + uVar19 * 8);
    if (*(DdNode **)(lVar13 + 8) != (DdNode *)0x0) {
      pDVar7 = (DdNode *)*puVar10;
      pDVar8 = Cudd_bddExistAbstract(dd,pDVar7,*(DdNode **)(lVar13 + 8));
      *puVar10 = pDVar8;
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(dd,pDVar7);
      pDVar7 = (DdNode *)puVar10[1];
      pDVar8 = Cudd_bddExistAbstract(dd,pDVar7,*(DdNode **)(lVar13 + 8));
      puVar10[1] = pDVar8;
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(dd,pDVar7);
      iVar5 = Cudd_SupportSize(dd,(DdNode *)puVar10[1]);
      *(short *)((long)puVar10 + 0x14) = (short)iVar5;
      iVar5 = Cudd_DagSize((DdNode *)*puVar10);
      *(int *)(puVar10 + 2) = iVar5;
      if ((long)uVar19 < lVar9) {
        Cudd_RecursiveDeref(dd,*(DdNode **)(lVar13 + 8));
        *(undefined8 *)(lVar13 + 8) = 0;
      }
    }
    pDVar7 = (DdNode *)*puVar10;
    *(DdNode **)(lVar13 + 0x10) = pDVar7;
    Cudd_Ref(pDVar7);
  }
  pBVar16 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar9 * 8);
  do {
    uVar23 = dd->size;
    if (dd->size < 1) {
      uVar23 = 0;
    }
    uVar25 = (ulong)uVar23;
    uVar19 = 0xffffffffffffffff;
    dVar28 = 100000000000000.0;
    for (uVar21 = 0; uVar23 = (uint)uVar19, uVar21 != uVar25; uVar21 = uVar21 + 1) {
      lVar13 = *(long *)((long)__ptr_00 + uVar21 * 8);
      if ((lVar13 != 0) && (*(int *)(lVar13 + 0x10) == 2)) {
        dVar29 = 0.0;
        paVar18 = (anon_union_16_2_50f58667_for_type *)(lVar13 + 8);
        while (pDVar7 = (paVar18->kids).T, pDVar7 != dd->one) {
          iVar5 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + (ulong)pDVar7->index * 8) + 0x28) +
                          0x10);
          dVar29 = dVar29 + (double)(iVar5 * iVar5);
          paVar18 = &pDVar7->type;
        }
        if (dVar29 < dVar28) {
          uVar19 = uVar21 & 0xffffffff;
          dVar28 = dVar29;
        }
      }
    }
    if ((int)uVar23 < 0) {
      for (uVar21 = 0; uVar23 = (uint)uVar19, uVar21 != uVar25; uVar21 = uVar21 + 1) {
        lVar13 = *(long *)((long)__ptr_00 + uVar21 * 8);
        if (lVar13 != 0) {
          if (*(int *)(lVar13 + 0x10) < 2) {
            __assert_fail("pVars[v]->nParts > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                          ,0x3d9,
                          "int Bbr_FindBestVariable(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **)"
                         );
          }
          dVar29 = 0.0;
          paVar18 = (anon_union_16_2_50f58667_for_type *)(lVar13 + 8);
          while (pDVar7 = (paVar18->kids).T, pDVar7 != dd->one) {
            iVar5 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + (ulong)pDVar7->index * 8) + 0x28)
                            + 0x10);
            dVar29 = dVar29 + (double)(iVar5 * iVar5);
            paVar18 = &pDVar7->type;
          }
          if (dVar29 < dVar28) {
            uVar19 = uVar21 & 0xffffffff;
            dVar28 = dVar29;
          }
        }
      }
      if (uVar23 == 0xffffffff) {
        uVar19 = 0;
        uVar21 = (ulong)(uint)dd->size;
        if (dd->size < 1) {
          uVar21 = uVar19;
        }
        while (uVar21 != uVar19) {
          lVar13 = uVar19 * 8;
          uVar19 = uVar19 + 1;
          if (*(long *)((long)__ptr_00 + lVar13) != 0) {
            __assert_fail("pVars[v] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                          ,0xd3,
                          "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                         );
          }
        }
        free(__ptr_00);
        pBVar15 = (Bbr_ImageTree_t *)calloc(1,0x30);
        pBVar15->pCare = pBVar16;
        pBVar15->nBddMax = nBddMax;
        pBVar15->fVerbose = fVerbose;
        uVar19 = 0xffffffffffffffff;
        uVar21 = 0;
        uVar25 = 0xffffffff;
        do {
          while( true ) {
            iVar5 = (int)uVar25;
            uVar27 = (ulong)iVar5;
            if (uVar21 == uVar24) break;
            if (*(long *)((long)__ptr_01 + uVar21 * 8) != 0) {
              if (iVar5 != -1) {
                uVar19 = uVar19 & 0xffffffff;
                uVar21 = uVar21 & 0xffffffff;
                pBVar16 = Bbr_CombineTwoNodes(dd,dd->one,
                                              *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar27 * 8),
                                              *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar21 * 8));
                *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar27 * 8) = pBVar16;
                pBVar16 = (Bbr_ImageNode_t *)0x0;
                goto LAB_00659119;
              }
              uVar25 = uVar21 & 0xffffffff;
            }
            uVar21 = uVar21 + 1;
          }
          if (iVar5 == -1) {
            __assert_fail("n1 != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                          ,0x364,
                          "Bbr_ImageNode_t *Bbr_MergeTopNodes(DdManager *, int, Bbr_ImageNode_t **)"
                         );
          }
          pBVar16 = *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar27 * 8);
          uVar21 = uVar27;
LAB_00659119:
          *(undefined8 *)((long)__ptr_01 + uVar21 * 8) = 0;
          pBVar15->pRoot = pBVar16;
          uVar21 = 0;
          uVar25 = uVar19 & 0xffffffff;
        } while (pBVar16 == (Bbr_ImageNode_t *)0x0);
        lVar13 = 0;
        while (lVar13 <= lVar9) {
          lVar22 = lVar13 * 8;
          lVar13 = lVar13 + 1;
          if (*(long *)((long)__ptr_01 + lVar22) != 0) {
            __assert_fail("pNodes[v] == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                          ,0xe2,
                          "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                         );
          }
        }
        free(__ptr_01);
        pDVar7 = Cudd_Support(dd,bCare);
        pBVar15->bCareSupp = pDVar7;
        Cudd_Ref(pDVar7);
        Bbr_DeleteParts_rec(pBVar16);
        goto LAB_00659195;
      }
    }
    lVar13 = (long)(int)uVar23;
    piVar4 = *(int **)((long)__ptr_00 + lVar13 * 8);
    iVar5 = Cudd_SupportSize(dd,*(DdNode **)(piVar4 + 2));
    if (iVar5 != piVar4[4]) {
      __assert_fail("nSupp == pVar->nParts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                    ,0x2f1,
                    "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                   );
    }
    if (iVar5 == 2) {
      lVar26 = (long)**(int **)(piVar4 + 2);
      lVar22 = (long)**(int **)(*(int **)(piVar4 + 2) + 4);
      pBVar14 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar26 * 8);
      pNode2 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar22 * 8);
      pDVar7 = dd->vars[*piVar4];
      Cudd_Ref(pDVar7);
      for (uVar19 = 0; uVar25 != uVar19; uVar19 = uVar19 + 1) {
        pDVar8 = pDVar7;
        if (((uVar23 != uVar19) &&
            (piVar4 = *(int **)((long)__ptr_00 + uVar19 * 8), piVar4 != (int *)0x0)) &&
           (*(long *)(piVar4 + 2) == *(long *)(*(long *)((long)__ptr_00 + lVar13 * 8) + 8))) {
          pDVar8 = Cudd_bddAnd(dd,pDVar7,dd->vars[*piVar4]);
          Cudd_Ref(pDVar8);
          Cudd_RecursiveDeref(dd,pDVar7);
          pvVar3 = *(void **)((long)__ptr_00 + uVar19 * 8);
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + 8));
          free(pvVar3);
          *(undefined8 *)((long)__ptr_00 + uVar19 * 8) = 0;
        }
        pDVar7 = pDVar8;
      }
      pvVar3 = *(void **)((long)__ptr_00 + lVar13 * 8);
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + 8));
      free(pvVar3);
      *(undefined8 *)((long)__ptr_00 + lVar13 * 8) = 0;
      pBVar14 = Bbr_CombineTwoNodes(dd,pDVar7,pBVar14,pNode2);
      Cudd_RecursiveDeref(dd,pDVar7);
    }
    else {
      if (iVar5 == 1) {
        __assert_fail("nSupp != 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x2f2,
                      "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                     );
      }
      paVar18 = (anon_union_16_2_50f58667_for_type *)(piVar4 + 2);
      uVar21 = 0xffffffff;
      uVar19 = 0xffffffffffffffff;
      iVar5 = 1000000;
      iVar6 = 1000000;
      while( true ) {
        pDVar7 = (paVar18->kids).T;
        if (pDVar7 == dd->one) break;
        uVar27 = (ulong)pDVar7->index;
        iVar2 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + uVar27 * 8) + 0x28) + 0x10);
        uVar25 = uVar21;
        iVar20 = iVar2;
        iVar17 = iVar5;
        if (iVar5 <= iVar2) {
          uVar25 = uVar19 & 0xffffffff;
          if (iVar2 < iVar6) {
            uVar25 = uVar27;
          }
          uVar27 = uVar21;
          iVar20 = iVar5;
          iVar17 = iVar2;
          if (iVar6 < iVar2) {
            iVar17 = iVar6;
          }
        }
        uVar21 = uVar27;
        paVar18 = &pDVar7->type;
        uVar19 = uVar25;
        iVar5 = iVar20;
        iVar6 = iVar17;
      }
      lVar26 = (long)(int)uVar21;
      lVar22 = (long)(int)uVar19;
      pNode2 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar22 * 8);
      pBVar14 = Bbr_CombineTwoNodes(dd,dd->one,*(Bbr_ImageNode_t **)((long)__ptr_01 + lVar26 * 8),
                                    pNode2);
    }
    *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar26 * 8) = pBVar14;
    *(undefined8 *)((long)__ptr_01 + lVar22 * 8) = 0;
    paVar18 = (anon_union_16_2_50f58667_for_type *)&pNode2->pPart->bSupp;
    while (pDVar7 = (paVar18->kids).T, pDVar7 != dd->one) {
      lVar13 = *(long *)((long)__ptr_00 + (ulong)pDVar7->index * 8);
      if (lVar13 != 0) {
        iVar5 = Cudd_bddLeq(dd,*(DdNode **)(lVar13 + 8),dd->vars[lVar22]);
        if (iVar5 == 0) {
          __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0x333,
                        "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                       );
        }
        pDVar8 = *(DdNode **)(lVar13 + 8);
        pDVar11 = Cudd_bddExistAbstract(dd,pDVar8,dd->vars[lVar22]);
        *(DdNode **)(lVar13 + 8) = pDVar11;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(dd,pDVar8);
        pDVar8 = *(DdNode **)(lVar13 + 8);
        pDVar11 = Cudd_bddAnd(dd,pDVar8,dd->vars[lVar26]);
        *(DdNode **)(lVar13 + 8) = pDVar11;
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(dd,pDVar8);
        iVar5 = Cudd_SupportSize(dd,*(DdNode **)(lVar13 + 8));
        *(int *)(lVar13 + 0x10) = iVar5;
      }
      paVar18 = &pDVar7->type;
    }
  } while (dd->keys - dd->dead <= (uint)nBddMax);
  for (lVar13 = 0; lVar13 < dd->size; lVar13 = lVar13 + 1) {
    pvVar3 = *(void **)((long)__ptr_00 + lVar13 * 8);
    if (pvVar3 != (void *)0x0) {
      free(pvVar3);
      *(undefined8 *)((long)__ptr_00 + lVar13 * 8) = 0;
    }
  }
  free(__ptr_00);
  for (lVar13 = 0; lVar13 <= lVar9; lVar13 = lVar13 + 1) {
    pBVar16 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar13 * 8);
    if (pBVar16 != (Bbr_ImageNode_t *)0x0) {
      Bbr_DeleteParts_rec(pBVar16);
      Bbr_bddImageTreeDelete_rec(pBVar16);
    }
  }
  free(__ptr_01);
  pBVar15 = (Bbr_ImageTree_t *)0x0;
LAB_00659195:
  free(__ptr);
  return pBVar15;
}

Assistant:

Bbr_ImageTree_t * Bbr_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int nBddMax, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Bbr_ImageTree_t * pTree;
    Bbr_ImagePart_t ** pParts;
    Bbr_ImageVar_t ** pVars;
    Bbr_ImageNode_t ** pNodes, * pCare;
    int fStop, v;

    if ( fVerbose && dd->size <= 80 )
        Bbr_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Bbr_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Bbr_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Bbr_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    pCare  = pNodes[nParts];

    // process the nodes
    while ( Bbr_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars, &fStop, nBddMax ) );

    // consider the case of BDD node blowup
    if ( fStop )
    {
        for ( v = 0; v < dd->size; v++ )
            if ( pVars[v] )
                ABC_FREE( pVars[v] );
        ABC_FREE( pVars );
        for ( v = 0; v <= nParts; v++ )
            if ( pNodes[v] )
            {
                Bbr_DeleteParts_rec( pNodes[v] );
                Bbr_bddImageTreeDelete_rec( pNodes[v] );
            }
        ABC_FREE( pNodes );
        ABC_FREE( pParts );
        return NULL;
    }

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Bbr_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Bbr_ImageTree_t) );
    pTree->pCare = pCare;
    pTree->nBddMax = nBddMax;
    pTree->fVerbose = fVerbose;

    // merge the topmost nodes
    while ( (pTree->pRoot = Bbr_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Bbr_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Bbr_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );

    return pTree;
}